

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t *in_00;
  uint uVar8;
  uint bit;
  size_t twonexceptions;
  
  uVar1 = *in;
  uVar8 = 0;
  uVar3 = uVar1 >> 0x10 & 0x3ff;
  bit = uVar1 >> 0x1a;
  uVar4 = (ulong)uVar1 & 0xffff;
  twonexceptions = (size_t)(uVar3 * 2);
  if ((uVar1 & 0xffff) == 0) {
    uVar4 = 0;
  }
  else {
    Simple16<false>::decodeArray
              (&this->ecoder,in + 1,uVar4,
               (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,&twonexceptions);
  }
  in_00 = in + 1 + uVar4;
  lVar5 = 0;
  for (; uVar8 < 0x80; uVar8 = uVar8 + 0x20) {
    fastunpack(in_00,(uint32_t *)((long)out + lVar5),bit);
    lVar5 = lVar5 + 0x80;
    in_00 = (uint32_t *)((long)in_00 + (ulong)(bit * 4));
  }
  puVar2 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)(uVar3 << 2);
  uVar4 = 0xffffffffffffffff;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 4) {
    uVar4 = (ulong)(uint)((int)uVar4 + 1 + *(int *)((long)puVar2 + uVar6));
    out[uVar4] = out[uVar4] | *(int *)((long)puVar2 + uVar6 + uVar7) + 1 << (bit & 0x1f);
  }
  *nvalue = lVar5 >> 2;
  return in_00;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t *const initout(out);
  const uint32_t b = *in >> (32 - PFORDELTA_B);
  const size_t nExceptions = (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
                             ((1 << PFORDELTA_NEXCEPT) - 1);
  const uint32_t encodedExceptionsSize = *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

  size_t twonexceptions = 2 * nExceptions;
  ++in;
  if (encodedExceptionsSize > 0)
    ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                       twonexceptions);
  assert(twonexceptions >= 2 * nExceptions);
  in += encodedExceptionsSize;

  uint32_t *beginout(out); // we use this later

  for (uint32_t j = 0; j < BlockSize; j += 32) {
    fastunpack(in, out, b);
    in += b;
    out += 32;
  }

  for (uint32_t e = 0, lpos = -1; e < nExceptions; e++) {
    lpos += exceptions[e] + 1;
    beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
  }

  nvalue = out - initout;
  return in;
}